

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveType.cpp
# Opt level: O0

void __thiscall hdc::PrimitiveType::PrimitiveType(PrimitiveType *this)

{
  PrimitiveType *this_local;
  
  Type::Type(&this->super_Type);
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_002206d0;
  Token::Token(&this->token);
  (this->super_Type).super_ASTNode.kind = AST_PRIMITIVE_TYPE;
  return;
}

Assistant:

PrimitiveType::PrimitiveType() {
    this->kind = AST_PRIMITIVE_TYPE;
}